

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quality_estimate.c
# Opt level: O0

int VP8EstimateQuality(uint8_t *data,size_t size)

{
  VP8StatusCode VVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong in_RSI;
  ulong uVar4;
  uint8_t *in_RDI;
  double dVar5;
  int base_q;
  int n;
  int q [4];
  int absolute_delta;
  int update_map;
  int s;
  WebPBitstreamFeatures features;
  int Q;
  int ok;
  uint64_t sig;
  uint64_t bit_pos;
  size_t pos;
  size_t in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int iVar6;
  uint32_t local_88 [7];
  uint32_t local_6c;
  uint32_t local_68;
  int local_64;
  int local_54;
  int local_50;
  uint32_t local_38;
  int local_34;
  ulong local_30;
  uint64_t local_28;
  ulong local_20;
  ulong local_18;
  uint8_t *local_10;
  int local_4;
  
  local_20 = 0;
  local_30 = 0;
  local_34 = 0;
  local_38 = 0xffffffff;
  if (in_RDI == (uint8_t *)0x0) {
    local_4 = -1;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    VVar1 = WebPGetFeatures((uint8_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                            ,in_stack_ffffffffffffff68,(WebPBitstreamFeatures *)0x10256e);
    if (VVar1 == VP8_STATUS_OK) {
      if (local_50 == 2) {
        local_4 = 0x65;
      }
      else if ((local_50 == 0) || (local_54 != 0)) {
        local_4 = -1;
      }
      else {
        do {
          if (local_18 <= local_20) goto LAB_00102618;
          uVar4 = local_20 + 1;
          local_30 = local_30 >> 8 | (ulong)local_10[local_20] << 0x28;
          local_20 = uVar4;
        } while (local_30 >> 0x18 != 0x2a019d);
        local_34 = 1;
LAB_00102618:
        if (local_34 == 0) {
          local_4 = -1;
        }
        else if (local_18 < local_20 + 4) {
          local_4 = -1;
        }
        else {
          local_20 = local_20 + 4;
          local_28 = local_20 * 8;
          GetBit(local_10,2,local_18,&local_28);
          uVar2 = GetBit(local_10,1,local_18,&local_28);
          if (uVar2 != 0) {
            local_68 = GetBit(local_10,1,local_18,&local_28);
            uVar2 = GetBit(local_10,1,local_18,&local_28);
            if (uVar2 != 0) {
              local_6c = GetBit(local_10,1,local_18,&local_28);
              memset(local_88,0,0x10);
              for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
                uVar2 = GetBit(local_10,1,local_18,&local_28);
                if (uVar2 != 0) {
                  uVar2 = GetBit(local_10,7,local_18,&local_28);
                  local_88[local_64] = uVar2;
                  uVar2 = GetBit(local_10,1,local_18,&local_28);
                  if (uVar2 != 0) {
                    local_88[local_64] = -local_88[local_64];
                  }
                }
              }
              if (local_6c != 0) {
                local_38 = local_88[0];
              }
              for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
                uVar2 = GetBit(local_10,1,local_18,&local_28);
                if (uVar2 != 0) {
                  GetBit(local_10,7,local_18,&local_28);
                }
              }
            }
            if (local_68 != 0) {
              for (local_64 = 0; local_64 < 3; local_64 = local_64 + 1) {
                uVar2 = GetBit(local_10,1,local_18,&local_28);
                if (uVar2 != 0) {
                  GetBit(local_10,8,local_18,&local_28);
                }
              }
            }
          }
          GetBit(local_10,10,local_18,&local_28);
          uVar2 = GetBit(local_10,1,local_18,&local_28);
          if ((uVar2 != 0) && (uVar2 = GetBit(local_10,1,local_18,&local_28), uVar2 != 0)) {
            for (iVar6 = 0; iVar6 < 8; iVar6 = iVar6 + 1) {
              uVar2 = GetBit(local_10,1,local_18,&local_28);
              if (uVar2 != 0) {
                GetBit(local_10,6,local_18,&local_28);
              }
            }
          }
          GetBit(local_10,2,local_18,&local_28);
          uVar2 = GetBit(local_10,7,local_18,&local_28);
          uVar3 = GetBit(local_10,1,local_18,&local_28);
          if (uVar3 != 0) {
            GetBit(local_10,5,local_18,&local_28);
          }
          uVar3 = GetBit(local_10,1,local_18,&local_28);
          if (uVar3 != 0) {
            GetBit(local_10,5,local_18,&local_28);
          }
          uVar3 = GetBit(local_10,1,local_18,&local_28);
          if (uVar3 != 0) {
            GetBit(local_10,5,local_18,&local_28);
          }
          uVar3 = GetBit(local_10,1,local_18,&local_28);
          if (uVar3 != 0) {
            GetBit(local_10,5,local_18,&local_28);
          }
          uVar3 = GetBit(local_10,1,local_18,&local_28);
          if (uVar3 != 0) {
            GetBit(local_10,5,local_18,&local_28);
          }
          if ((int)local_38 < 0) {
            local_38 = uVar2;
          }
          if (local_28 == 0x8000000000000000) {
            local_4 = -1;
          }
          else {
            local_38 = (int)((0x7f - local_38) * 100) / 0x7f;
            if ((int)local_38 < 0x50) {
              dVar5 = pow((double)(int)local_38 / 80.0,2.6315789473684212);
              local_38 = (uint32_t)(dVar5 * 80.0);
            }
            local_4 = local_38;
          }
        }
      }
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int VP8EstimateQuality(const uint8_t* const data, size_t size) {
  size_t pos = 0;
  uint64_t bit_pos;
  uint64_t sig = 0x00;
  int ok = 0;
  int Q = -1;
  WebPBitstreamFeatures features;

  if (data == NULL) return -1;

  if (WebPGetFeatures(data, size, &features) != VP8_STATUS_OK) {
    return -1;   // invalid file
  }
  if (features.format == 2) return 101;  // lossless
  if (features.format == 0 || features.has_animation) return -1;   // mixed

  while (pos < size) {
    sig = (sig >> 8) | ((uint64_t)data[pos++] << 40);
    if ((sig >> 24) == 0x2a019dull) {
      ok = 1;
      break;
    }
  }
  if (!ok) return -1;
  if (pos + 4 > size) return -1;

  // Skip main Header
  // width  = (data[pos + 0] | (data[pos + 1] << 8)) & 0x3fff;
  // height = (data[pos + 2] | (data[pos + 3] << 8)) & 0x3fff;
  pos += 4;
  bit_pos = pos * 8;

  GET_BIT(2);  // colorspace + clamp type

  // Segment header
  if (GET_BIT(1)) {       // use_segment
    int s;
    const int update_map = GET_BIT(1);
    if (GET_BIT(1)) {     // update data
      const int absolute_delta = GET_BIT(1);
      int q[4]  = { 0, 0, 0, 0 };
      for (s = 0; s < 4; ++s) {
        if (GET_BIT(1)) {
          q[s] = GET_BIT(7);
          if (GET_BIT(1)) q[s] = -q[s];   // sign
        }
      }
      if (absolute_delta) Q = q[0];  // just use the first segment's quantizer
      for (s = 0; s < 4; ++s) CONDITIONAL_SKIP(7);   //  filter strength
    }
    if (update_map) {
      for (s = 0; s < 3; ++s) CONDITIONAL_SKIP(8);
    }
  }
  // Filter header
  GET_BIT(1 + 6 + 3);     // simple + level + sharpness
  if (GET_BIT(1)) {       // use_lf_delta
    if (GET_BIT(1)) {     // update lf_delta?
      int n;
      for (n = 0; n < 4 + 4; ++n) CONDITIONAL_SKIP(6);
    }
  }
  // num partitions
  GET_BIT(2);

  // ParseQuant
  {
    const int base_q = GET_BIT(7);
    /* dqy1_dc = */ CONDITIONAL_SKIP(5);
    /* dqy2_dc = */ CONDITIONAL_SKIP(5);
    /* dqy2_ac = */ CONDITIONAL_SKIP(5);
    /* dquv_dc = */ CONDITIONAL_SKIP(5);
    /* dquv_ac = */ CONDITIONAL_SKIP(5);

    if (Q < 0) Q = base_q;
  }
  if (bit_pos == INVALID_BIT_POS) return -1;

  // base mapping
  Q = (127 - Q) * 100 / 127;
  // correction for power-law behavior in low range
  if (Q < 80) {
    Q = (int)(pow(Q / 80., 1. / 0.38) * 80);
  }
  return Q;
}